

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::IsPathToMacOSSharedLibrary(string *path)

{
  bool bVar1;
  string_view str;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  if (bVar1) {
    str._M_str = (path->_M_dataplus)._M_p;
    str._M_len = path->_M_string_length;
    bVar1 = cmHasLiteralSuffix<7ul>(str,(char (*) [7])".dylib");
    return bVar1;
  }
  return false;
}

Assistant:

bool cmSystemTools::IsPathToMacOSSharedLibrary(const std::string& path)
{
  return (cmSystemTools::FileIsFullPath(path) &&
          cmHasLiteralSuffix(path, ".dylib"));
}